

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O0

void GmmResFree(GMM_RESOURCE_INFO *pRes)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  GMM_RESOURCE_INFO *pRes_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (pRes != (GMM_RESOURCE_INFO *)0x0) {
    iVar1 = (*(pRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
    if ((*(ulong *)(CONCAT44(extraout_var,iVar1) + 8) >> 0x29 & 1) == 0) {
      if (pRes != (GMM_RESOURCE_INFO *)0x0) {
        (*(pRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[4])();
      }
    }
    else {
      GmmLib::GmmResourceInfoLin::GmmResourceInfoLin((GmmResourceInfoLin *)&pRes_local);
      GmmLib::GmmResourceInfoLin::operator=(pRes,(GmmResourceInfoLin *)&pRes_local);
      GmmLib::GmmResourceInfoLin::~GmmResourceInfoLin((GmmResourceInfoLin *)&pRes_local);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void GMM_STDCALL GmmResFree(GMM_RESOURCE_INFO *pRes)
{
    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(pRes, VOIDRETURN);

#if(!defined(__GMM_KMD__) && !defined(GMM_UNIFIED_LIB))
    GmmResFreeThroughClientCtxt(pRes);
#else

    if(pRes->GetResFlags().Info.__PreallocatedResInfo)
    {
        *pRes = GmmLib::GmmResourceInfo();
    }
    else
    {
        delete pRes;
        pRes = NULL;
    }

#endif
}